

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O2

long testSerializeQuoteRequest(int count)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  allocator<char> local_2a5;
  int local_2a4;
  long local_2a0;
  STRING local_298;
  FieldBase local_278;
  NoRelatedSym noRelatedSym;
  string local_1a8 [32];
  QuoteRequest message;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"1",(allocator<char> *)&local_298);
  FIX::QuoteReqID::QuoteReqID((QuoteReqID *)&noRelatedSym,(STRING *)&local_278);
  FIX42::QuoteRequest::QuoteRequest(&message,(QuoteReqID *)&noRelatedSym);
  local_2a4 = count;
  FIX::FieldBase::~FieldBase((FieldBase *)&noRelatedSym);
  std::__cxx11::string::~string((string *)&local_278);
  FIX42::QuoteRequest::NoRelatedSym::NoRelatedSym(&noRelatedSym);
  iVar2 = 10;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"IBM",&local_2a5);
    FIX::Symbol::Symbol((Symbol *)&local_278,&local_298);
    FIX42::QuoteRequest::NoRelatedSym::set
              ((NoRelatedSym *)&noRelatedSym.super_Group,(Symbol *)&local_278);
    FIX::FieldBase::~FieldBase(&local_278);
    std::__cxx11::string::~string((string *)&local_298);
    FIX::MaturityMonthYear::MaturityMonthYear((MaturityMonthYear *)&local_278);
    FIX42::QuoteRequest::NoRelatedSym::set
              ((NoRelatedSym *)&noRelatedSym.super_Group,(MaturityMonthYear *)&local_278);
    FIX::FieldBase::~FieldBase(&local_278);
    FIX::PutOrCall::PutOrCall((PutOrCall *)&local_278,0);
    FIX42::QuoteRequest::NoRelatedSym::set
              ((NoRelatedSym *)&noRelatedSym.super_Group,(PutOrCall *)&local_278);
    FIX::FieldBase::~FieldBase(&local_278);
    local_298._M_dataplus._M_p = (pointer)0x405e000000000000;
    FIX::StrikePrice::StrikePrice((StrikePrice *)&local_278,(PRICE *)&local_298);
    FIX42::QuoteRequest::NoRelatedSym::set
              ((NoRelatedSym *)&noRelatedSym.super_Group,(StrikePrice *)&local_278);
    FIX::FieldBase::~FieldBase(&local_278);
    FIX::Side::Side((Side *)&local_278,"11FIX.4.2");
    FIX42::QuoteRequest::NoRelatedSym::set
              ((NoRelatedSym *)&noRelatedSym.super_Group,(Side *)&local_278);
    FIX::FieldBase::~FieldBase(&local_278);
    local_298._M_dataplus._M_p = (pointer)0x4059000000000000;
    FIX::OrderQty::OrderQty((OrderQty *)&local_278,(QTY *)&local_298);
    FIX42::QuoteRequest::NoRelatedSym::set
              ((NoRelatedSym *)&noRelatedSym.super_Group,(OrderQty *)&local_278);
    FIX::FieldBase::~FieldBase(&local_278);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"USD",&local_2a5);
    FIX::Currency::Currency((Currency *)&local_278,&local_298);
    FIX42::QuoteRequest::NoRelatedSym::set
              ((NoRelatedSym *)&noRelatedSym.super_Group,(Currency *)&local_278);
    FIX::FieldBase::~FieldBase(&local_278);
    std::__cxx11::string::~string((string *)&local_298);
    FIX::OrdType::OrdType((OrdType *)&local_278,"1FIX.4.2");
    FIX42::QuoteRequest::NoRelatedSym::set
              ((NoRelatedSym *)&noRelatedSym.super_Group,(OrdType *)&local_278);
    FIX::FieldBase::~FieldBase(&local_278);
    FIX::Message::addGroup((Message *)&message,&noRelatedSym.super_Group);
  }
  local_2a0 = GetTickCount();
  iVar2 = 0;
  if (0 < local_2a4) {
    iVar2 = local_2a4;
  }
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    FIX::Message::toString_abi_cxx11_((int)local_1a8,(int)&message,8);
    std::__cxx11::string::~string(local_1a8);
  }
  lVar1 = GetTickCount();
  lVar1 = lVar1 - local_2a0;
  FIX::FieldMap::~FieldMap((FieldMap *)&noRelatedSym);
  FIX::Message::~Message((Message *)&message);
  return lVar1;
}

Assistant:

long testSerializeQuoteRequest(int count) {
  FIX42::QuoteRequest message(FIX::QuoteReqID("1"));
  FIX42::QuoteRequest::NoRelatedSym noRelatedSym;

  for (int i = 1; i <= 10; ++i) {
    noRelatedSym.set(FIX::Symbol("IBM"));
    noRelatedSym.set(FIX::MaturityMonthYear());
    noRelatedSym.set(FIX::PutOrCall(FIX::PutOrCall_PUT));
    noRelatedSym.set(FIX::StrikePrice(120));
    noRelatedSym.set(FIX::Side(FIX::Side_BUY));
    noRelatedSym.set(FIX::OrderQty(100));
    noRelatedSym.set(FIX::Currency("USD"));
    noRelatedSym.set(FIX::OrdType(FIX::OrdType_MARKET));
    message.addGroup(noRelatedSym);
  }

  count = count - 1;

  long start = GetTickCount();
  for (int j = 0; j <= count; ++j) {
    message.toString();
  }
  return GetTickCount() - start;
}